

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O1

int convert_16sp(uchar *data,_sample *gus_sample)

{
  ulong uVar1;
  byte *pbVar2;
  undefined2 *puVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  short *psVar10;
  int *piVar11;
  long lVar12;
  uchar *puVar13;
  ushort *puVar14;
  long lVar15;
  ushort uVar16;
  undefined2 uVar17;
  ushort *puVar18;
  byte *pbVar19;
  long lVar20;
  ulong uVar21;
  
  uVar5 = gus_sample->loop_end;
  uVar6 = gus_sample->data_length;
  uVar7 = gus_sample->loop_start;
  uVar21 = (ulong)(uVar5 - uVar7);
  uVar1 = (ulong)uVar6 + uVar21 * 2;
  psVar10 = (short *)calloc((uVar1 >> 1) + 2,2);
  gus_sample->data = psVar10;
  if (psVar10 == (short *)0x0) {
    piVar11 = __errno_location();
    _WM_ERROR("convert_16sp",0x1b8,1,"to parse sample",*piVar11);
    iVar9 = -1;
  }
  else {
    lVar8 = uVar21 * 2;
    lVar12 = 0;
    do {
      lVar15 = lVar12;
      pbVar2 = data + lVar15;
      bVar4 = *pbVar2;
      *(ushort *)((long)psVar10 + lVar15) = (ushort)bVar4;
      *(ushort *)((long)psVar10 + lVar15) = CONCAT11(pbVar2[1],bVar4);
      lVar12 = lVar15 + 2;
    } while (pbVar2 + 2 < data + uVar7);
    pbVar2 = data + lVar12;
    bVar4 = *pbVar2;
    *(ushort *)((long)psVar10 + lVar12) = (ushort)bVar4;
    uVar17 = CONCAT11(pbVar2[1],bVar4);
    *(undefined2 *)((long)psVar10 + lVar12) = uVar17;
    lVar20 = (long)psVar10 + lVar8 + lVar12;
    puVar3 = (undefined2 *)((long)psVar10 + lVar8 + lVar12);
    puVar14 = puVar3 + 1;
    *puVar3 = uVar17;
    puVar18 = (ushort *)((long)psVar10 + lVar15 + 4);
    lVar12 = (long)psVar10 + lVar8 + lVar12 + 4;
    puVar13 = data + lVar15 + 6;
    pbVar2 = pbVar2 + 2;
    do {
      pbVar19 = pbVar2;
      bVar4 = *pbVar19;
      *puVar18 = (ushort)bVar4;
      uVar16 = CONCAT11(pbVar19[1],bVar4);
      *puVar18 = uVar16;
      *(ushort *)(lVar20 + -2) = uVar16;
      lVar20 = lVar20 + -2;
      *puVar14 = *puVar18;
      puVar14 = puVar14 + 1;
      puVar18 = puVar18 + 1;
      puVar13 = puVar13 + 2;
      lVar12 = lVar12 + 2;
      pbVar2 = pbVar19 + 2;
    } while (pbVar19 + 2 < data + uVar5);
    bVar4 = pbVar19[2];
    *puVar18 = (ushort)bVar4;
    uVar16 = CONCAT11(pbVar19[3],bVar4);
    *puVar18 = uVar16;
    *puVar14 = uVar16;
    if (pbVar19 + 4 != data + uVar6) {
      lVar15 = 0;
      do {
        pbVar2 = puVar13 + lVar15;
        bVar4 = *pbVar2;
        *(ushort *)(lVar12 + lVar15) = (ushort)bVar4;
        *(ushort *)(lVar12 + lVar15) = CONCAT11(pbVar2[1],bVar4);
        lVar15 = lVar15 + 2;
      } while (pbVar2 + 2 < data + uVar6);
    }
    gus_sample->modes = gus_sample->modes ^ 8;
    gus_sample->loop_start = uVar5 >> 1;
    gus_sample->loop_end = (int)lVar8 + uVar5 >> 1;
    gus_sample->data_length = (uint)(uVar1 >> 1) & 0x7fffffff;
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int convert_16sp(unsigned char *data, struct _sample *gus_sample) {
	unsigned long int loop_length = gus_sample->loop_end
			- gus_sample->loop_start;
	unsigned long int dloop_length = loop_length * 2;
	unsigned long int new_length = gus_sample->data_length + dloop_length;
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->loop_start;
	signed short int *write_data = NULL;
	signed short int *write_data_a = NULL;
	signed short int *write_data_b = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc(((new_length >> 1) + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data = (*read_data++);
			*write_data++ |= (*read_data++) << 8;
		} while (read_data < read_end);

		*write_data = (*read_data++);
		*write_data |= (*read_data++) << 8;
		write_data_a = write_data + (dloop_length >> 1);
		*write_data_a-- = *write_data;
		write_data++;
		write_data_b = write_data + (dloop_length >> 1);
		read_end = data + gus_sample->loop_end;
		do {
			*write_data = (*read_data++);
			*write_data |= (*read_data++) << 8;
			*write_data_a-- = *write_data;
			*write_data_b++ = *write_data;
			write_data++;
		} while (read_data < read_end);

		*write_data = *(read_data++);
		*write_data |= (*read_data++) << 8;
		*write_data_b++ = *write_data;
		read_end = data + gus_sample->data_length;
		if (read_data != read_end) {
			do {
				*write_data_b = *(read_data++);
				*write_data_b++ |= (*read_data++) << 8;
			} while (read_data < read_end);
		}
		gus_sample->loop_start += loop_length;
		gus_sample->loop_end += dloop_length;
		gus_sample->data_length = new_length;
		gus_sample->modes ^= SAMPLE_PINGPONG;
		gus_sample->loop_start >>= 1;
		gus_sample->loop_end >>= 1;
		gus_sample->data_length >>= 1;
		return 0;
	}

	_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_MEM, "to parse sample", errno);
	return -1;
}